

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_functional_test.cc
# Opt level: O2

void iterator_uncommited_seeks(void)

{
  FILE *pFVar1;
  fdb_status fVar2;
  char *pcVar3;
  fdb_doc *rdoc;
  fdb_iterator *it;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  fdb_kvs_config kvs_config;
  timeval __test_begin;
  fdb_config fconfig;
  
  gettimeofday((timeval *)&__test_begin,(__timezone_ptr_t)0x0);
  rdoc = (fdb_doc *)0x0;
  memleak_start();
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  system("rm -rf  iterator_test* > errorlog.txt");
  fVar2 = fdb_open(&dbfile,"./iterator_test1",&fconfig);
  pFVar1 = _stderr;
  if (fVar2 != FDB_RESULT_SUCCESS) {
    pcVar3 = fdb_error_msg(fVar2);
    fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar2,pcVar3,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xfbf);
    iterator_uncommited_seeks()::__test_pass = 1;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0xfbf,"void iterator_uncommited_seeks()");
  }
  fVar2 = fdb_kvs_open_default(dbfile,&db,&kvs_config);
  pFVar1 = _stderr;
  if (fVar2 != FDB_RESULT_SUCCESS) {
    pcVar3 = fdb_error_msg(fVar2);
    fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar2,pcVar3,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xfc0);
    iterator_uncommited_seeks()::__test_pass = 1;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0xfc0,"void iterator_uncommited_seeks()");
  }
  fdb_set_kv(db,"a",1,(void *)0x0,0);
  fdb_set_kv(db,"b",1,(void *)0x0,0);
  fdb_set_kv(db,"c",1,(void *)0x0,0);
  fVar2 = fdb_iterator_init(db,&it,"b",1,(void *)0x0,0,0);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xfc7);
    iterator_uncommited_seeks()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0xfc7,"void iterator_uncommited_seeks()");
  }
  fVar2 = fdb_iterator_seek_to_min(it);
  pFVar1 = _stderr;
  if (fVar2 != FDB_RESULT_SUCCESS) {
    pcVar3 = fdb_error_msg(fVar2);
    fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar2,pcVar3,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xfcb);
    iterator_uncommited_seeks()::__test_pass = 1;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0xfcb,"void iterator_uncommited_seeks()");
  }
  fVar2 = fdb_iterator_get(it,&rdoc);
  pFVar1 = _stderr;
  if (fVar2 != FDB_RESULT_SUCCESS) {
    pcVar3 = fdb_error_msg(fVar2);
    fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar2,pcVar3,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xfcd);
    iterator_uncommited_seeks()::__test_pass = 1;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0xfcd,"void iterator_uncommited_seeks()");
  }
  if (*rdoc->key != 'b') {
    fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n","b",rdoc->key,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xfce);
    iterator_uncommited_seeks()::__test_pass = 1;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0xfce,"void iterator_uncommited_seeks()");
  }
  fdb_doc_free(rdoc);
  rdoc = (fdb_doc *)0x0;
  fVar2 = fdb_iterator_seek_to_max(it);
  pFVar1 = _stderr;
  if (fVar2 != FDB_RESULT_SUCCESS) {
    pcVar3 = fdb_error_msg(fVar2);
    fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar2,pcVar3,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xfd4);
    iterator_uncommited_seeks()::__test_pass = 1;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0xfd4,"void iterator_uncommited_seeks()");
  }
  fVar2 = fdb_iterator_get(it,&rdoc);
  pFVar1 = _stderr;
  if (fVar2 == FDB_RESULT_SUCCESS) {
    if (*rdoc->key != 'c') {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n","c",rdoc->key,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0xfd7);
      iterator_uncommited_seeks()::__test_pass = 1;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0xfd7,"void iterator_uncommited_seeks()");
    }
    fdb_doc_free(rdoc);
    rdoc = (fdb_doc *)0x0;
    fVar2 = fdb_iterator_prev(it);
    pFVar1 = _stderr;
    if (fVar2 != FDB_RESULT_SUCCESS) {
      pcVar3 = fdb_error_msg(fVar2);
      fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar2,pcVar3,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0xfdd);
      iterator_uncommited_seeks()::__test_pass = 1;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0xfdd,"void iterator_uncommited_seeks()");
    }
    fVar2 = fdb_iterator_get(it,&rdoc);
    pFVar1 = _stderr;
    if (fVar2 != FDB_RESULT_SUCCESS) {
      pcVar3 = fdb_error_msg(fVar2);
      fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar2,pcVar3,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0xfdf);
      iterator_uncommited_seeks()::__test_pass = 1;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0xfdf,"void iterator_uncommited_seeks()");
    }
    if (*rdoc->key == 'b') {
      fdb_doc_free(rdoc);
      rdoc = (fdb_doc *)0x0;
      fVar2 = fdb_iterator_next(it);
      pFVar1 = _stderr;
      if (fVar2 != FDB_RESULT_SUCCESS) {
        pcVar3 = fdb_error_msg(fVar2);
        fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar2,pcVar3,
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                ,0xfe6);
        iterator_uncommited_seeks()::__test_pass = 1;
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                      ,0xfe6,"void iterator_uncommited_seeks()");
      }
      fVar2 = fdb_iterator_get(it,&rdoc);
      pFVar1 = _stderr;
      if (fVar2 == FDB_RESULT_SUCCESS) {
        if (*rdoc->key == 'c') {
          fdb_doc_free(rdoc);
          rdoc = (fdb_doc *)0x0;
          fdb_iterator_close(it);
          fdb_close(dbfile);
          fdb_shutdown();
          memleak_end();
          pcVar3 = "%s PASSED\n";
          if (iterator_uncommited_seeks()::__test_pass != '\0') {
            pcVar3 = "%s FAILED\n";
          }
          fprintf(_stderr,pcVar3,"iterator single doc range");
          return;
        }
        fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n","c",rdoc->key,
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                ,0xfe9);
        iterator_uncommited_seeks()::__test_pass = 1;
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                      ,0xfe9,"void iterator_uncommited_seeks()");
      }
      pcVar3 = fdb_error_msg(fVar2);
      fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar2,pcVar3,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0xfe8);
      iterator_uncommited_seeks()::__test_pass = 1;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0xfe8,"void iterator_uncommited_seeks()");
    }
    fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n","b",rdoc->key,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xfe0);
    iterator_uncommited_seeks()::__test_pass = 1;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0xfe0,"void iterator_uncommited_seeks()");
  }
  pcVar3 = fdb_error_msg(fVar2);
  fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar2,pcVar3,
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
          ,0xfd6);
  iterator_uncommited_seeks()::__test_pass = 1;
  __assert_fail("false",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                ,0xfd6,"void iterator_uncommited_seeks()");
}

Assistant:

void iterator_uncommited_seeks()
{
    TEST_INIT();

    int r;

    fdb_status status;
    fdb_kvs_handle *db;
    fdb_file_handle *dbfile;
    fdb_iterator *it;
    fdb_doc *rdoc;
    rdoc=NULL;

    memleak_start();

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();

    r = system(SHELL_DEL" iterator_test* > errorlog.txt");
    (void)r;
    TEST_STATUS(fdb_open(&dbfile, "./iterator_test1", &fconfig));
    TEST_STATUS(fdb_kvs_open_default(dbfile, &db, &kvs_config));

    fdb_set_kv(db, "a", 1, NULL, 0);
    fdb_set_kv(db, "b", 1, NULL, 0);
    fdb_set_kv(db, "c", 1, NULL, 0);

    status = fdb_iterator_init(db, &it, "b", 1, NULL, 0, FDB_ITR_NONE);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // to 'b'
    status = fdb_iterator_seek_to_min(it);
    TEST_STATUS(status);
    status = fdb_iterator_get(it, &rdoc);
    TEST_STATUS(status);
    TEST_CMP(rdoc->key, "b", 1);
    fdb_doc_free(rdoc);
    rdoc=NULL;

    // to 'c'
    status = fdb_iterator_seek_to_max(it);
    TEST_STATUS(status);
    status = fdb_iterator_get(it, &rdoc);
    TEST_STATUS(status);
    TEST_CMP(rdoc->key, "c", 1);
    fdb_doc_free(rdoc);
    rdoc=NULL;

    // to 'b'
    status = fdb_iterator_prev(it);
    TEST_STATUS(status);
    status = fdb_iterator_get(it, &rdoc);
    TEST_STATUS(status);
    TEST_CMP(rdoc->key, "b", 1);
    fdb_doc_free(rdoc);
    rdoc=NULL;

    // to 'c'
    status = fdb_iterator_next(it);
    TEST_STATUS(status);
    status = fdb_iterator_get(it, &rdoc);
    TEST_STATUS(status);
    TEST_CMP(rdoc->key, "c", 1);
    fdb_doc_free(rdoc);
    rdoc=NULL;

    fdb_iterator_close(it);

    fdb_close(dbfile);
    fdb_shutdown();
    memleak_end();
    TEST_RESULT("iterator single doc range");
}